

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O0

void __thiscall
TElasticity3DAnalytic::graduxy<double>
          (TElasticity3DAnalytic *this,TPZVec<double> *x,TPZFMatrix<double> *grad)

{
  int64_t iVar1;
  double *pdVar2;
  long *in_RDX;
  TPZVec<double> *in_RSI;
  undefined8 in_RDI;
  int j;
  int i_1;
  TPZManVector<Fad<double>,_3> result;
  Fad<double> temp;
  int i;
  TPZManVector<Fad<double>,_3> xfad;
  int sz;
  TPZVec<Fad<double>_> *in_stack_00001830;
  TPZVec<Fad<double>_> *in_stack_00001838;
  TElasticity3DAnalytic *in_stack_00001840;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  Fad<double> *in_stack_fffffffffffffe70;
  TPZManVector<Fad<double>,_3> *in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  TPZFMatrix<double> *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffea0;
  int iVar3;
  undefined4 in_stack_fffffffffffffea4;
  int iVar4;
  TPZVec<Fad<double>_> local_158 [3];
  int64_t in_stack_ffffffffffffff08;
  TPZManVector<Fad<double>,_3> *in_stack_ffffffffffffff10;
  int local_a4;
  TPZVec<Fad<double>_> local_a0 [4];
  int local_1c;
  long *local_18;
  TPZVec<double> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar1 = TPZVec<double>::size(in_RSI);
  local_1c = (int)iVar1;
  TPZManVector<Fad<double>,_3>::TPZManVector(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  for (local_a4 = 0; local_a4 < local_1c; local_a4 = local_a4 + 1) {
    in_stack_fffffffffffffe88 = local_1c;
    in_stack_fffffffffffffe8c = local_a4;
    in_stack_fffffffffffffe90 =
         (TPZFMatrix<double> *)TPZVec<double>::operator[](local_10,(long)local_a4);
    Fad<double>::Fad((Fad<double> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     (int)((ulong)in_RDI >> 0x20),(int)in_RDI,(double *)in_stack_fffffffffffffe90);
    TPZVec<Fad<double>_>::operator[](local_a0,(long)local_a4);
    Fad<double>::operator=
              (in_stack_fffffffffffffe70,
               (Fad<double> *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    Fad<double>::~Fad(in_stack_fffffffffffffe70);
  }
  TPZManVector<Fad<double>,_3>::TPZManVector(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  uxy<Fad<double>>(in_stack_00001840,in_stack_00001838,in_stack_00001830);
  (**(code **)(*local_18 + 0x68))(local_18,(long)local_1c);
  for (iVar4 = 0; iVar4 < local_1c; iVar4 = iVar4 + 1) {
    for (iVar3 = 0; iVar3 < local_1c; iVar3 = iVar3 + 1) {
      TPZVec<Fad<double>_>::operator[](local_158,(long)iVar4);
      in_stack_fffffffffffffe80 =
           (TPZManVector<Fad<double>,_3> *)
           Fad<double>::d(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
      in_stack_fffffffffffffe70 =
           (Fad<double> *)(in_stack_fffffffffffffe80->super_TPZVec<Fad<double>_>)._vptr_TPZVec;
      pdVar2 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffe90,
                          CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                          (int64_t)in_stack_fffffffffffffe80);
      *pdVar2 = (double)in_stack_fffffffffffffe70;
    }
  }
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_stack_fffffffffffffe80);
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_stack_fffffffffffffe80);
  return;
}

Assistant:

void TElasticity3DAnalytic::graduxy(const TPZVec<TVar> &x, TPZFMatrix<TVar> &grad) const
{
    int sz = x.size();
#ifdef PZDEBUG
    if(sz != 3)
    {
        DebugStop();
    }
#endif
    TPZManVector<Fad<TVar>,3> xfad(sz);
    for(int i=0; i<sz; i++)
    {
        Fad<TVar> temp = Fad<TVar>(sz,i,x[i]);
        xfad[i] = temp;
        
    }
    TPZManVector<Fad<TVar>,3> result(3);
    uxy(xfad,result);
    grad.Resize(sz,sz);
    for (int i=0; i<sz; i++) {
        for (int j=0; j<sz; j++)
        {
            grad(j,i) = result[i].d(j);
        }
    }
    
}